

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.hxx
# Opt level: O2

const_iterator __thiscall
cmsys::
hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::begin(hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this)

{
  pointer pp_Var1;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var2;
  ulong uVar3;
  const_iterator cVar4;
  
  pp_Var1 = (this->_M_ht)._M_buckets.
            super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = 0;
  do {
    if ((ulong)((long)(this->_M_ht)._M_buckets.
                      super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3) <= uVar3) {
      p_Var2 = (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0;
      break;
    }
    p_Var2 = pp_Var1[uVar3];
    uVar3 = uVar3 + 1;
  } while (p_Var2 == (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0);
  cVar4._M_ht = &this->_M_ht;
  cVar4._M_cur = p_Var2;
  return cVar4;
}

Assistant:

const_iterator begin() const { return _M_ht.begin(); }